

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  LazyExpression *other;
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_type sVar13;
  size_t sVar14;
  size_type sVar15;
  int iVar16;
  MessageBuilder builder;
  StringRef local_d0;
  long local_c0 [2];
  AssertionResultData *local_b0;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *local_a8;
  undefined1 local_a0 [40];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68 [2];
  SourceLineInfo local_40;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_001cca80;
  uVar2 = *(undefined4 *)((long)&(_assertionResult->m_info).macroName.m_start + 4);
  sVar13 = (_assertionResult->m_info).macroName.m_size;
  uVar3 = *(undefined4 *)((long)&(_assertionResult->m_info).macroName.m_size + 4);
  uVar4 = *(undefined4 *)&(_assertionResult->m_info).lineInfo.file;
  uVar5 = *(undefined4 *)((long)&(_assertionResult->m_info).lineInfo.file + 4);
  sVar14 = (_assertionResult->m_info).lineInfo.line;
  uVar6 = *(undefined4 *)((long)&(_assertionResult->m_info).lineInfo.line + 4);
  uVar7 = *(undefined4 *)&(_assertionResult->m_info).capturedExpression.m_start;
  uVar8 = *(undefined4 *)((long)&(_assertionResult->m_info).capturedExpression.m_start + 4);
  sVar15 = (_assertionResult->m_info).capturedExpression.m_size;
  uVar9 = *(undefined4 *)((long)&(_assertionResult->m_info).capturedExpression.m_size + 4);
  *(undefined4 *)&(this->assertionResult).m_info.macroName.m_start =
       *(undefined4 *)&(_assertionResult->m_info).macroName.m_start;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_start + 4) = uVar2;
  *(int *)&(this->assertionResult).m_info.macroName.m_size = (int)sVar13;
  *(undefined4 *)((long)&(this->assertionResult).m_info.macroName.m_size + 4) = uVar3;
  *(undefined4 *)&(this->assertionResult).m_info.lineInfo.file = uVar4;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.file + 4) = uVar5;
  *(int *)&(this->assertionResult).m_info.lineInfo.line = (int)sVar14;
  *(undefined4 *)((long)&(this->assertionResult).m_info.lineInfo.line + 4) = uVar6;
  *(undefined4 *)&(this->assertionResult).m_info.capturedExpression.m_start = uVar7;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_start + 4) = uVar8;
  *(int *)&(this->assertionResult).m_info.capturedExpression.m_size = (int)sVar15;
  *(undefined4 *)((long)&(this->assertionResult).m_info.capturedExpression.m_size + 4) = uVar9;
  uVar2 = *(undefined4 *)&(_assertionResult->m_info).field_0x34;
  (this->assertionResult).m_info.resultDisposition = (_assertionResult->m_info).resultDisposition;
  *(undefined4 *)&(this->assertionResult).m_info.field_0x34 = uVar2;
  local_b0 = &(this->assertionResult).m_resultData;
  (this->assertionResult).m_resultData.message._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.message.field_2;
  pcVar1 = (_assertionResult->m_resultData).message._M_dataplus._M_p;
  local_a8 = _infoMessages;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,pcVar1,
             pcVar1 + (_assertionResult->m_resultData).message._M_string_length);
  (this->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->assertionResult).m_resultData.reconstructedExpression.field_2;
  pcVar1 = (_assertionResult->m_resultData).reconstructedExpression._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->assertionResult).m_resultData.reconstructedExpression,pcVar1,
             pcVar1 + (_assertionResult->m_resultData).reconstructedExpression._M_string_length);
  other = &(_assertionResult->m_resultData).lazyExpression;
  LazyExpression::LazyExpression(&(this->assertionResult).m_resultData.lazyExpression,other);
  (this->assertionResult).m_resultData.resultType = (_assertionResult->m_resultData).resultType;
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,local_a8);
  (this->totals).testCases.failedButOk = (_totals->testCases).failedButOk;
  iVar16 = _totals->error;
  uVar2 = *(undefined4 *)&_totals->field_0x4;
  sVar14 = (_totals->assertions).passed;
  sVar10 = (_totals->assertions).failed;
  sVar11 = (_totals->assertions).failedButOk;
  sVar12 = (_totals->testCases).failed;
  (this->totals).testCases.passed = (_totals->testCases).passed;
  (this->totals).testCases.failed = sVar12;
  (this->totals).assertions.failed = sVar10;
  (this->totals).assertions.failedButOk = sVar11;
  (this->totals).error = iVar16;
  *(undefined4 *)&(this->totals).field_0x4 = uVar2;
  (this->totals).assertions.passed = sVar14;
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       other->m_transientExpression;
  if ((this->assertionResult).m_resultData.message._M_string_length != 0) {
    local_d0.m_start = (this->assertionResult).m_info.macroName.m_start;
    local_d0.m_size = (this->assertionResult).m_info.macroName.m_size;
    local_40.file = (this->assertionResult).m_info.lineInfo.file;
    local_40.line = (this->assertionResult).m_info.lineInfo.line;
    MessageBuilder::MessageBuilder
              ((MessageBuilder *)local_a0,&local_d0,&local_40,
               (this->assertionResult).m_resultData.resultType);
    pcVar1 = (this->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_d0.m_start = (char *)local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar1,
               pcVar1 + (this->assertionResult).m_resultData.message._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_a0._16_8_,local_d0.m_start,local_d0.m_size);
    if ((long *)local_d0.m_start != local_c0) {
      operator_delete(local_d0.m_start,local_c0[0] + 1);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_d0);
    if ((long *)local_d0.m_start != local_c0) {
      operator_delete(local_d0.m_start,local_c0[0] + 1);
    }
    clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              (&this->infoMessages,(value_type *)(local_a0 + 0x18));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != local_68) {
      operator_delete(local_78._M_p,local_68[0]._M_allocated_capacity + 1);
    }
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_a0);
  }
  return;
}

Assistant:

AssertionStats::AssertionStats( AssertionResult const& _assertionResult,
                                     std::vector<MessageInfo> const& _infoMessages,
                                     Totals const& _totals )
    :   assertionResult( _assertionResult ),
        infoMessages( _infoMessages ),
        totals( _totals )
    {
        assertionResult.m_resultData.lazyExpression.m_transientExpression = _assertionResult.m_resultData.lazyExpression.m_transientExpression;

        if( assertionResult.hasMessage() ) {
            // Copy message into messages list.
            // !TBD This should have been done earlier, somewhere
            MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
            builder << assertionResult.getMessage();
            builder.m_info.message = builder.m_stream.str();

            infoMessages.push_back( builder.m_info );
        }
    }